

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O1

base_learner * cbify_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  bool bVar2;
  vw *all_00;
  options_i *options_00;
  undefined8 uVar3;
  int iVar4;
  _func_int ***ppp_Var5;
  option_group_definition *poVar6;
  typed_option<float> *ptVar7;
  base_learner *pbVar8;
  multi_learner *base;
  learner<cbify,_example> *plVar9;
  single_learner *base_00;
  long lVar10;
  undefined **ppuVar11;
  label_parser *plVar12;
  parser *ppVar13;
  cbify *data;
  byte bVar14;
  float fVar15;
  float fVar16;
  bool use_cs;
  uint32_t num_actions;
  size_type __dnew_4;
  size_type __dnew_1;
  option_group_definition new_options;
  size_type __dnew;
  size_type __dnew_2;
  size_type __dnew_3;
  bool local_525;
  uint local_524;
  cbify *local_520;
  float *local_518;
  vw *local_510;
  _func_int ***local_508;
  _func_int **local_500;
  _func_int **local_4f8 [2];
  float *local_4e8;
  options_i *local_4e0;
  long local_4d8;
  _func_int ***local_4d0;
  _func_int **local_4c8;
  _func_int **local_4c0 [2];
  _func_int ***local_4b0;
  _func_int **local_4a8;
  _func_int **local_4a0 [2];
  _func_int ***local_490;
  _func_int **local_488;
  _func_int **local_480 [2];
  string local_470;
  string local_450;
  undefined1 local_430 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  string local_400 [88];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_398;
  option_group_definition local_390;
  long *local_358;
  long local_350;
  long local_348 [2];
  undefined1 local_338 [112];
  bool local_2c8;
  ios_base local_2b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2a0;
  string local_1b0;
  string local_190;
  typed_option<float> local_170;
  typed_option<float> local_d0;
  
  bVar14 = 0;
  local_524 = 0;
  local_520 = calloc_or_throw<cbify>(1);
  memset(local_520,0,0xd0);
  local_338._0_8_ = (_func_int **)0x26;
  local_508 = local_4f8;
  local_508 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_508,(ulong)local_338);
  local_4f8[0] = (_func_int **)local_338._0_8_;
  local_508[2] = (_func_int **)0x6e6f43206f746e69;
  local_508[3] = (_func_int **)0x206c617574786574;
  *local_508 = (_func_int **)0x6c754d20656b614d;
  local_508[1] = (_func_int **)0x207373616c636974;
  builtin_strncpy((char *)((long)local_508 + 0x1e),"l Bandit",8);
  local_500 = (_func_int **)local_338._0_8_;
  *(char *)((long)local_508 + local_338._0_8_) = '\0';
  local_390.m_name._M_dataplus._M_p = (pointer)&local_390.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_390,local_508,(char *)(local_338._0_8_ + (long)local_508));
  local_390.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_390.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_390.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_508 != local_4f8) {
    operator_delete(local_508);
  }
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  local_450.field_2._M_allocated_capacity._0_4_ = 0x66696263;
  local_450.field_2._M_allocated_capacity._4_2_ = 0x79;
  local_450._M_string_length = 5;
  local_510 = all;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_338,&local_450,&local_524);
  local_2c8 = true;
  local_490 = local_480;
  local_430._0_8_ = (_func_int **)0x42;
  ppp_Var5 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_490,(ulong)local_430);
  uVar3 = local_430._0_8_;
  local_480[0] = (_func_int **)local_430._0_8_;
  local_490 = ppp_Var5;
  memcpy(ppp_Var5,"Convert multiclass on <k> classes into a contextual bandit problem",0x42);
  local_488 = (_func_int **)uVar3;
  *(char *)((long)ppp_Var5 + uVar3) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_338 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (&local_390,(typed_option<unsigned_int> *)local_338);
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  local_470.field_2._M_allocated_capacity = 0x73635f7966696263;
  local_470._M_string_length = 8;
  local_470.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_430,&local_470,&local_525);
  local_4b0 = local_4a0;
  local_170.super_base_option._vptr_base_option = (_func_int **)0x44;
  ppp_Var5 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_4b0,(ulong)&local_170);
  pp_Var1 = local_170.super_base_option._vptr_base_option;
  local_4a0[0] = local_170.super_base_option._vptr_base_option;
  local_4e0 = options;
  local_4b0 = ppp_Var5;
  memcpy(ppp_Var5,"consume cost-sensitive classification examples instead of multiclass",0x44);
  local_4a8 = pp_Var1;
  *(undefined1 *)((long)ppp_Var5 + (long)pp_Var1) = 0;
  std::__cxx11::string::_M_assign(local_400);
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar6,(typed_option<bool> *)local_430);
  local_190.field_2._M_allocated_capacity._0_4_ = 0x73736f6c;
  local_190.field_2._M_allocated_capacity._4_2_ = 0x30;
  local_190._M_string_length = 5;
  local_518 = &local_520->loss0;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  VW::config::typed_option<float>::typed_option(&local_170,&local_190,local_518);
  ptVar7 = VW::config::typed_option<float>::default_value(&local_170,0.0);
  local_4d0 = local_4c0;
  local_d0.super_base_option._vptr_base_option = (_func_int **)0x16;
  local_4d0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_4d0,(ulong)&local_d0);
  local_4c0[0] = local_d0.super_base_option._vptr_base_option;
  *local_4d0 = (_func_int **)0x726f662073736f6c;
  local_4d0[1] = (_func_int **)0x74636572726f6320;
  builtin_strncpy((char *)((long)local_4d0 + 0xe),"ct label",8);
  local_4c8 = local_d0.super_base_option._vptr_base_option;
  *(char *)((long)local_4d0 + (long)local_d0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar7->super_base_option).m_help);
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar6,ptVar7)
  ;
  local_1b0.field_2._M_allocated_capacity._0_4_ = 0x73736f6c;
  local_1b0.field_2._M_allocated_capacity._4_2_ = 0x31;
  local_1b0._M_string_length = 5;
  local_4e8 = &local_520->loss1;
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  VW::config::typed_option<float>::typed_option(&local_d0,&local_1b0,local_4e8);
  ptVar7 = VW::config::typed_option<float>::default_value(&local_d0,1.0);
  local_4d8 = 0x18;
  local_358 = local_348;
  local_358 = (long *)std::__cxx11::string::_M_create((ulong *)&local_358,(ulong)&local_4d8);
  local_348[0] = local_4d8;
  *local_358 = 0x726f662073736f6c;
  local_358[1] = 0x6572726f636e6920;
  local_358[2] = 0x6c6562616c207463;
  local_350 = local_4d8;
  *(char *)((long)local_358 + local_4d8) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar7->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar6,ptVar7);
  if (local_358 != local_348) {
    operator_delete(local_358);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d8610;
  if (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  data = local_520;
  if (local_4d0 != local_4c0) {
    operator_delete(local_4d0);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d8610;
  if (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  options_00 = local_4e0;
  if (local_4b0 != local_4a0) {
    operator_delete(local_4b0);
  }
  local_430._0_8_ = &PTR__typed_option_002d8500;
  if (local_398._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_398._M_pi);
  }
  if (local_3a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_430);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p);
  }
  if (local_490 != local_480) {
    operator_delete(local_490);
  }
  local_338._0_8_ = &PTR__typed_option_002d8648;
  if (local_2a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2a0._M_pi);
  }
  if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p);
  }
  (**options_00->_vptr_options_i)(options_00,&local_390);
  pp_Var1 = (_func_int **)(local_338 + 0x10);
  local_338._16_4_ = 0x66696263;
  local_338._20_2_ = 0x79;
  local_338._8_8_ = (pointer)0x5;
  local_338._0_8_ = pp_Var1;
  iVar4 = (*options_00->_vptr_options_i[1])(options_00,local_338);
  if ((_func_int **)local_338._0_8_ != pp_Var1) {
    operator_delete((void *)local_338._0_8_);
  }
  if ((char)iVar4 == '\0') {
    plVar9 = (learner<cbify,_example> *)0x0;
    goto LAB_001c45d7;
  }
  local_338._16_4_ = 0x655f6263;
  local_338._20_2_ = 0x7078;
  local_338[0x16] = 0x6c;
  local_338[0x17] = 0x6f;
  local_338[0x18] = 'r';
  local_338[0x19] = 'e';
  local_338[0x1a] = '_';
  local_338[0x1b] = 'a';
  local_338._28_2_ = 0x6664;
  local_338._8_8_ = (pointer)0xe;
  local_338[0x1e] = '\0';
  local_338._0_8_ = pp_Var1;
  iVar4 = (*options_00->_vptr_options_i[1])(options_00);
  data->use_adf = SUB41(iVar4,0);
  if ((_func_int **)local_338._0_8_ != pp_Var1) {
    operator_delete((void *)local_338._0_8_);
  }
  data->app_seed = 0x337ad8c;
  (data->a_s)._begin = (action_score *)0x0;
  (data->a_s)._end = (action_score *)0x0;
  (data->a_s).end_array = (action_score *)0x0;
  (data->a_s).erase_count = 0;
  data->all = local_510;
  if (data->use_adf == true) {
    init_adf_data(data,(ulong)local_524);
  }
  local_338._16_4_ = 0x655f6263;
  local_338._20_2_ = 0x7078;
  local_338[0x16] = 0x6c;
  local_338[0x17] = 0x6f;
  local_338[0x18] = 'r';
  local_338[0x19] = 'e';
  local_338._8_8_ = (pointer)0xa;
  local_338[0x1a] = '\0';
  local_338._0_8_ = pp_Var1;
  iVar4 = (*options_00->_vptr_options_i[1])(options_00);
  if ((char)iVar4 == '\0') {
    bVar2 = data->use_adf;
    if ((_func_int **)local_338._0_8_ != pp_Var1) {
      operator_delete((void *)local_338._0_8_);
    }
    if (bVar2 == false) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_338);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_338 + 0x10));
      local_430._16_5_ = 0x78655f6263;
      local_430._21_3_ = 0x6f6c70;
      local_418._M_allocated_capacity._0_2_ = 0x6572;
      local_430._8_8_ = (pointer)0xa;
      local_418._M_local_buf[2] = '\0';
      local_430._0_8_ = local_430 + 0x10;
      std::__cxx11::stringbuf::str();
      (*options_00->_vptr_options_i[5])(options_00,local_430,&local_170);
      if (local_170.super_base_option._vptr_base_option !=
          (_func_int **)&local_170.super_base_option.m_name._M_string_length) {
        operator_delete(local_170.super_base_option._vptr_base_option);
      }
      if ((undefined1 *)local_430._0_8_ != local_430 + 0x10) {
        operator_delete((void *)local_430._0_8_);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
      std::ios_base::~ios_base(local_2b8);
    }
  }
  else if ((_func_int **)local_338._0_8_ != pp_Var1) {
    operator_delete((void *)local_338._0_8_);
  }
  if (data->use_adf == true) {
    local_338._16_4_ = 0x6d5f6263;
    local_338._20_2_ = 0x6e69;
    local_338[0x16] = 0x5f;
    local_338[0x17] = 99;
    local_338[0x18] = 'o';
    local_338[0x19] = 's';
    local_338[0x1a] = 't';
    local_338._8_8_ = (pointer)0xb;
    local_338[0x1b] = '\0';
    local_338._0_8_ = pp_Var1;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_430,
               vsnprintf,0x3a,"%f",(double)*local_518);
    (*options_00->_vptr_options_i[5])(options_00,local_338,local_430);
    if ((undefined1 *)local_430._0_8_ != local_430 + 0x10) {
      operator_delete((void *)local_430._0_8_);
    }
    if ((_func_int **)local_338._0_8_ != pp_Var1) {
      operator_delete((void *)local_338._0_8_);
    }
    local_338._16_4_ = 0x6d5f6263;
    local_338._20_2_ = 0x7861;
    local_338[0x16] = 0x5f;
    local_338[0x17] = 99;
    local_338[0x18] = 'o';
    local_338[0x19] = 's';
    local_338[0x1a] = 't';
    local_338._8_8_ = (pointer)0xb;
    local_338[0x1b] = '\0';
    local_338._0_8_ = pp_Var1;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_430,
               vsnprintf,0x3a,"%f",(double)*local_4e8);
    (*options_00->_vptr_options_i[5])(options_00,local_338,local_430);
    if ((undefined1 *)local_430._0_8_ != local_430 + 0x10) {
      operator_delete((void *)local_430._0_8_);
    }
    if ((_func_int **)local_338._0_8_ != pp_Var1) {
      operator_delete((void *)local_338._0_8_);
    }
  }
  local_338._16_4_ = 0x65736162;
  local_338._20_2_ = 0x696c;
  local_338[0x16] = 0x6e;
  local_338[0x17] = 0x65;
  local_338._8_8_ = (pointer)0x8;
  local_338[0x18] = '\0';
  local_338._0_8_ = pp_Var1;
  iVar4 = (*options_00->_vptr_options_i[1])(options_00);
  if ((_func_int **)local_338._0_8_ != pp_Var1) {
    operator_delete((void *)local_338._0_8_);
  }
  all_00 = local_510;
  if ((char)iVar4 != '\0') {
    std::__cxx11::stringstream::stringstream((stringstream *)local_338);
    fVar15 = ABS(*local_518);
    fVar16 = ABS(local_518[1]);
    if (fVar16 <= fVar15) {
      fVar16 = fVar15;
    }
    std::ostream::_M_insert<double>((double)(fVar16 / (local_518[1] - *local_518)));
    local_430._16_5_ = 0x756d5f726c;
    local_430._21_3_ = 0x69746c;
    local_418._M_allocated_capacity._0_2_ = 0x6c70;
    local_418._M_local_buf[2] = 'i';
    local_418._M_allocated_capacity._3_2_ = 0x7265;
    local_430._8_8_ = (pointer)0xd;
    local_418._M_local_buf[5] = '\0';
    local_430._0_8_ = local_430 + 0x10;
    std::__cxx11::stringbuf::str();
    (*options_00->_vptr_options_i[5])(options_00,local_430,&local_170);
    if (local_170.super_base_option._vptr_base_option !=
        (_func_int **)&local_170.super_base_option.m_name._M_string_length) {
      operator_delete(local_170.super_base_option._vptr_base_option);
    }
    if ((undefined1 *)local_430._0_8_ != local_430 + 0x10) {
      operator_delete((void *)local_430._0_8_);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
    std::ios_base::~ios_base(local_2b8);
  }
  if (data->use_adf == true) {
    pbVar8 = setup_base(options_00,all_00);
    base = LEARNER::as_multiline<char,char>(pbVar8);
    ppVar13 = all_00->p;
    if (local_525 == true) {
      plVar9 = LEARNER::learner<cbify,example>::
               init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                         (data,base,predict_or_learn_adf<true,true>,predict_or_learn_adf<false,true>
                          ,1,multiclass);
      goto LAB_001c450d;
    }
    plVar9 = LEARNER::learner<cbify,example>::
             init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                       (data,base,predict_or_learn_adf<true,false>,predict_or_learn_adf<false,false>
                        ,1,multiclass);
LAB_001c457f:
    *(undefined8 *)(plVar9 + 0x58) = *(undefined8 *)(plVar9 + 0x18);
    *(code **)(plVar9 + 0x68) = MULTICLASS::finish_example<cbify>;
    ppuVar11 = &MULTICLASS::mc_label;
  }
  else {
    pbVar8 = setup_base(options_00,all_00);
    base_00 = LEARNER::as_singleline<char,char>(pbVar8);
    ppVar13 = all_00->p;
    if (local_525 != true) {
      plVar9 = LEARNER::learner<cbify,example>::init_learner<LEARNER::learner<char,example>>
                         (data,base_00,predict_or_learn<true,false>,predict_or_learn<false,false>,1,
                          multiclass);
      goto LAB_001c457f;
    }
    plVar9 = LEARNER::learner<cbify,example>::init_learner<LEARNER::learner<char,example>>
                       (data,base_00,predict_or_learn<true,true>,predict_or_learn<false,true>,1,
                        multiclass);
LAB_001c450d:
    *(undefined8 *)(plVar9 + 0x58) = *(undefined8 *)(plVar9 + 0x18);
    *(code **)(plVar9 + 0x68) = COST_SENSITIVE::finish_example<cbify>;
    ppuVar11 = &COST_SENSITIVE::cs_label;
  }
  plVar12 = &ppVar13->lp;
  for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
    plVar12->default_label = (_func_void_void_ptr *)*ppuVar11;
    ppuVar11 = ppuVar11 + (ulong)bVar14 * -2 + 1;
    plVar12 = (label_parser *)((long)plVar12 + (ulong)bVar14 * -0x10 + 8);
  }
  *(undefined8 *)(plVar9 + 0xb8) = *(undefined8 *)(plVar9 + 0x18);
  *(undefined8 *)(plVar9 + 0xc0) = *(undefined8 *)(plVar9 + 0x20);
  *(code **)(plVar9 + 200) = finish;
  all_00->delete_prediction = (_func_void_void_ptr *)0x0;
  data = (cbify *)0x0;
LAB_001c45d7:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_390.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.m_name._M_dataplus._M_p != &local_390.m_name.field_2) {
    operator_delete(local_390.m_name._M_dataplus._M_p);
  }
  if (data != (cbify *)0x0) {
    destroy_free<cbify>(data);
  }
  return (base_learner *)plVar9;
}

Assistant:

base_learner* cbify_setup(options_i& options, vw& all)
{
  uint32_t num_actions = 0;
  auto data = scoped_calloc_or_throw<cbify>();
  bool use_cs;

  option_group_definition new_options("Make Multiclass into Contextual Bandit");
  new_options
      .add(make_option("cbify", num_actions)
               .keep()
               .help("Convert multiclass on <k> classes into a contextual bandit problem"))
      .add(make_option("cbify_cs", use_cs).help("consume cost-sensitive classification examples instead of multiclass"))
      .add(make_option("loss0", data->loss0).default_value(0.f).help("loss for correct label"))
      .add(make_option("loss1", data->loss1).default_value(1.f).help("loss for incorrect label"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("cbify"))
    return nullptr;

  data->use_adf = options.was_supplied("cb_explore_adf");
  data->app_seed = uniform_hash("vw", 2, 0);
  data->a_s = v_init<action_score>();
  data->all = &all;

  if (data->use_adf)
    init_adf_data(*data.get(), num_actions);

  if (!options.was_supplied("cb_explore") && !data->use_adf)
  {
    stringstream ss;
    ss << num_actions;
    options.insert("cb_explore", ss.str());
  }

  if (data->use_adf)
  {
    options.insert("cb_min_cost", to_string(data->loss0));
    options.insert("cb_max_cost", to_string(data->loss1));
  }

  if (options.was_supplied("baseline"))
  {
    stringstream ss;
    ss << max<float>(abs(data->loss0), abs(data->loss1)) / (data->loss1 - data->loss0);
    options.insert("lr_multiplier", ss.str());
  }

  learner<cbify, example>* l;

  if (data->use_adf)
  {
    multi_learner* base = as_multiline(setup_base(options, all));
    if (use_cs)
      l = &init_cost_sensitive_learner(
          data, base, predict_or_learn_adf<true, true>, predict_or_learn_adf<false, true>, all.p, 1);
    else
      l = &init_multiclass_learner(
          data, base, predict_or_learn_adf<true, false>, predict_or_learn_adf<false, false>, all.p, 1);
  }
  else
  {
    single_learner* base = as_singleline(setup_base(options, all));
    if (use_cs)
      l = &init_cost_sensitive_learner(
          data, base, predict_or_learn<true, true>, predict_or_learn<false, true>, all.p, 1);
    else
      l = &init_multiclass_learner(data, base, predict_or_learn<true, false>, predict_or_learn<false, false>, all.p, 1);
  }
  l->set_finish(finish);
  all.delete_prediction = nullptr;

  return make_base(*l);
}